

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncFind(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
           vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  int64_t local_60;
  size_t pos;
  StringLiteral *value;
  StringLiteral *source;
  int64_t start;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  start = (int64_t)parameters;
  parameters_local = (vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)funcName;
  funcName_local = (Identifier *)__return_storage_ptr__;
  bVar1 = getExpFuncParameter(parameters,0,&value,funcName,false);
  if (bVar1) {
    bVar1 = getExpFuncParameter((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)start,1
                                ,(StringLiteral **)&pos,(Identifier *)parameters_local,false);
    if (bVar1) {
      source = (StringLiteral *)0x0;
      bVar1 = getExpFuncParameter((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)start
                                  ,2,(int64_t *)&source,(Identifier *)parameters_local,true);
      if (bVar1) {
        psVar2 = StringLiteral::string_abi_cxx11_(value);
        psVar3 = StringLiteral::string_abi_cxx11_((StringLiteral *)pos);
        local_60 = std::__cxx11::string::find((string *)psVar2,(ulong)psVar3);
        if (local_60 == -1) {
          local_60 = -1;
        }
        ExpressionValue::ExpressionValue(__return_storage_ptr__,local_60);
      }
      else {
        ExpressionValue::ExpressionValue(__return_storage_ptr__);
      }
    }
    else {
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
  }
  else {
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncFind(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	int64_t start;
	const StringLiteral* source;
	const StringLiteral* value;

	GET_PARAM(parameters,0,source);
	GET_PARAM(parameters,1,value);
	GET_OPTIONAL_PARAM(parameters,2,start,0);

	size_t pos = source->string().find(value->string(),(size_t)start);
	return ExpressionValue(pos == std::string::npos ? INT64_C(-1) : (int64_t) pos);
}